

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cc
# Opt level: O2

void __thiscall Generator::Generate(Generator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Head_base<0UL,_int,_false> _Var4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  iterator iVar8;
  char cVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  int iVar12;
  allocator local_389;
  _Head_base<2UL,_double,_false> local_388;
  vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
  *local_380;
  _Base_ptr local_378;
  double local_370;
  size_t local_368;
  Util *local_360;
  ulong local_358;
  key_type local_350;
  tuple<int,_double,_double> eval_stats;
  char puzzle [729];
  
  bVar1 = (this->options_).pencilmark;
  local_368 = 0x51;
  if (bVar1 != false) {
    local_368 = 0x2d9;
  }
  local_360 = &this->util_;
  this_00 = &this->pattern_set;
  local_380 = (vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
               *)&this->pattern_heap;
  local_378 = &(this->pattern_set)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_358 = 0;
  do {
    if ((this->options_).max_puzzles <= local_358) {
      return;
    }
    uVar6 = Util::RandomUInt(local_360);
    ppVar3 = (this->pattern_heap).
             super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)uVar6 %
             (ulong)(((long)(this->pattern_heap).
                            super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) / 0x28);
    memcpy(puzzle,ppVar3[uVar10].second._M_dataplus._M_p,local_368);
    if (bVar1 == false) {
      puzzle[0x51] = '\0';
    }
    Util::Permutation((vector<int,_std::allocator<int>_> *)&local_350,local_360,local_368);
    iVar7 = (this->options_).clues_to_drop;
    bVar5 = (this->options_).pencilmark;
    iVar12 = 0;
    _Var11._M_p = local_350._M_dataplus._M_p;
    while ((_Var11._M_p != (pointer)local_350._M_string_length && (iVar12 != iVar7))) {
      iVar2 = *(int *)_Var11._M_p;
      if (puzzle[iVar2] == '.') {
        if ((bVar5 & 1U) != 0) {
          cVar9 = (char)(iVar2 % 9) + '1';
LAB_001037ab:
          iVar12 = iVar12 + 1;
          puzzle[iVar2] = cVar9;
        }
      }
      else {
        cVar9 = '.';
        if ((bVar5 & 1U) == 0) goto LAB_001037ab;
      }
      _Var11._M_p = _Var11._M_p + 4;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_350);
    if ((this->options_).clues_to_drop < 1) {
LAB_001037fb:
      Evaluate(&eval_stats,this,puzzle);
      _Var4 = eval_stats.super__Tuple_impl<0UL,_int,_double,_double>.
              super__Head_base<0UL,_int,_false>;
      local_388 = eval_stats.super__Tuple_impl<0UL,_int,_double,_double>.
                  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                  super__Head_base<2UL,_double,_false>._M_head_impl;
      local_370 = eval_stats.super__Tuple_impl<0UL,_int,_double,_double>.
                  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                  _M_head_impl;
      if ((this->options_).clues_to_drop < 1) {
LAB_0010388a:
        if ((this->options_).display_all == true) {
          printf("%.729s %d %.1f %.2f\n",local_370,local_388._M_head_impl,puzzle,
                 (ulong)(uint)_Var4._M_head_impl);
        }
        if (local_388._M_head_impl <= **(double **)local_380) {
          if ((this->options_).display_all == false) {
            printf("%.729s %d %.1f %.2f\n",local_370,local_388._M_head_impl,puzzle,
                   (ulong)(uint)_Var4._M_head_impl);
          }
          std::__cxx11::string::string((string *)&local_350,puzzle,&local_389);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          local_350._M_string_length = (size_type)puzzle;
          local_350._M_dataplus._M_p = (pointer)local_388._M_head_impl;
          std::
          vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>
          ::emplace_back<std::pair<double,char*>>(local_380,(pair<double,_char_*> *)&local_350);
          std::
          push_heap<__gnu_cxx::__normal_iterator<std::pair<double,std::__cxx11::string>*,std::vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>>>
                    ((this->pattern_heap).
                     super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->pattern_heap).
                     super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::
          pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,std::__cxx11::string>*,std::vector<std::pair<double,std::__cxx11::string>,std::allocator<std::pair<double,std::__cxx11::string>>>>>
                    ((this->pattern_heap).
                     super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->pattern_heap).
                     super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&this_00->_M_t,
                         &(this->pattern_heap).
                          super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].second);
          if (iVar8._M_node != local_378) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase(&this_00->_M_t,
                    &(this->pattern_heap).
                     super__Vector_base<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].second);
          }
          std::
          vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back((vector<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_380);
        }
      }
      else {
        iVar7 = strncmp(puzzle,ppVar3[uVar10].second._M_dataplus._M_p,0x2d9);
        if (iVar7 != 0) {
          std::__cxx11::string::string((string *)&local_350,puzzle,&local_389);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&this_00->_M_t,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          if (iVar8._M_node == local_378) goto LAB_0010388a;
        }
      }
    }
    else {
      bVar5 = TdokuConstrain((this->options_).pencilmark,puzzle);
      if (bVar5) {
        if ((this->options_).minimize == true) {
          TdokuMinimize((this->options_).pencilmark,false,puzzle);
        }
        goto LAB_001037fb;
      }
    }
    local_358 = local_358 + 1;
  } while( true );
}

Assistant:

void Generate() {
        char puzzle[729];

        size_t size = options_.pencilmark ? 729 : 81;
        for (uint64_t i = 0; i < options_.max_puzzles; i++) {
            // draw a puzzle or pattern from the pool
            size_t which = util_.RandomUInt() % pattern_heap.size();
            string &pattern = pattern_heap[which].second;
            memcpy(puzzle, pattern.c_str(), size);
            if (size == 81) puzzle[81] = '\0';

            // randomly drop clues to unconstrain
            int dropped = 0;
            for (int j : util_.Permutation(size)) {
                if (dropped == options_.clues_to_drop) {
                    break;
                }
                if (puzzle[j] == '.') {
                    if (options_.pencilmark) {
                        puzzle[j] = (char) ('1' + (j % 9));
                        dropped++;
                    }
                } else {
                    if (!options_.pencilmark) {
                        puzzle[j] = '.';
                        dropped++;
                    }
                }
            }

            // randomly complete and minimize

            if (options_.clues_to_drop > 0) {
                if (!TdokuConstrain(options_.pencilmark, puzzle)) {
                    continue;
                }
                if (options_.minimize) {
                    TdokuMinimize(options_.pencilmark, false, puzzle);
                }
            }

            // evaluate difficulty via guess counting
            auto eval_stats = Evaluate(puzzle);
            int num_clues = get<0>(eval_stats);
            double geo_mean_guesses = get<1>(eval_stats);
            double loss = get<2>(eval_stats);

            // skip if the puzzle is a duplicate of one still in the pool
            if (options_.clues_to_drop > 0) {
                if (strncmp(puzzle, pattern.c_str(), 729) == 0) {
                    continue;
                }
                if (pattern_set.find(puzzle) != pattern_set.end()) {
                    continue;
                }
            }

            if (options_.display_all) {
                printf("%.729s %d %.1f %.2f\n", puzzle, num_clues, geo_mean_guesses, loss);
            }

            // skip if the puzzle's loss is greater than the highest in the pool
            if (loss > pattern_heap.front().first) {
                continue;
            }

            if (!options_.display_all) {
                printf("%.729s %d %.1f %.2f\n", puzzle, num_clues, geo_mean_guesses, loss);
            }

            // add the generated puzzle to the pool and kick out the one with highest loss
            pattern_set.insert(puzzle);
            pattern_heap.emplace_back(make_pair(loss, puzzle));
            push_heap(pattern_heap.begin(), pattern_heap.end());
            pop_heap(pattern_heap.begin(), pattern_heap.end());
            if (pattern_set.find(pattern_heap.back().second) != pattern_set.end()) {
                pattern_set.erase(pattern_heap.back().second);
            }
            pattern_heap.pop_back();
        }
    }